

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O0

void gray_rgb565_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                        JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  JSAMPARRAY ppJVar3;
  byte *pbVar4;
  uint uVar5;
  uint g_1;
  JLONG rgb_1;
  JDIMENSION num_cols_1;
  JDIMENSION col_1;
  JSAMPROW outptr_1;
  JSAMPROW inptr_1;
  int num_rows_local;
  JSAMPARRAY output_buf_local;
  JDIMENSION input_row_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  int test_value;
  uint g;
  JLONG rgb;
  JDIMENSION num_cols;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  int local_24;
  JSAMPARRAY local_20;
  uint local_14;
  
  num_cols = cinfo->output_width;
  local_24 = num_rows;
  local_20 = output_buf;
  local_14 = input_row;
  while (local_24 = local_24 + -1, -1 < local_24) {
    uVar5 = local_14 + 1;
    pbVar4 = (*input_buf)[local_14];
    ppJVar3 = local_20 + 1;
    outptr = *local_20;
    inptr = pbVar4;
    if (((ulong)outptr & 3) != 0) {
      inptr = pbVar4 + 1;
      bVar1 = *pbVar4;
      *(ushort *)outptr =
           (ushort)((bVar1 & 0xf8) << 8) | (ushort)((bVar1 & 0xfc) << 3) | (ushort)(bVar1 >> 3);
      outptr = (JSAMPROW)((long)outptr + 2);
      num_cols = num_cols - 1;
    }
    for (col = 0; col < num_cols >> 1; col = col + 1) {
      pbVar4 = inptr + 1;
      bVar1 = *inptr;
      inptr = inptr + 2;
      bVar2 = *pbVar4;
      *(uint *)outptr =
           ((bVar2 & 0xf8) << 8 | (bVar2 & 0xfc) << 3 | (uint)(bVar2 >> 3)) << 0x10 |
           (bVar1 & 0xf8) << 8 | (bVar1 & 0xfc) << 3 | (uint)(bVar1 >> 3);
      outptr = outptr + 4;
    }
    local_20 = ppJVar3;
    local_14 = uVar5;
    if ((num_cols & 1) != 0) {
      bVar1 = *inptr;
      *(ushort *)outptr =
           (ushort)((bVar1 & 0xf8) << 8) | (ushort)((bVar1 & 0xfc) << 3) | (ushort)(bVar1 >> 3);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
gray_rgb565_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                    JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  if (is_big_endian())
    gray_rgb565_convert_be(cinfo, input_buf, input_row, output_buf, num_rows);
  else
    gray_rgb565_convert_le(cinfo, input_buf, input_row, output_buf, num_rows);
}